

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O2

int hw_breakpoint_insert(CPUX86State *env,int index)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  vaddr len;
  CPUX86State *__mptr;
  uint uVar5;
  bool bVar6;
  
  uVar1 = env->dr[7];
  cVar2 = (char)index * '\x04';
  bVar3 = (char)index * '\x02';
  bVar6 = (uVar1 & (1L << (bVar3 & 0x3f) | 2L << (bVar3 & 0x3f))) != 0;
  switch((uint)(uVar1 >> (cVar2 + 0x10U & 0x3f)) & 3) {
  case 0:
    if (!bVar6) {
      return 0;
    }
    iVar4 = cpu_breakpoint_insert_x86_64
                      ((CPUState *)(env[-6].mtrr_var + 4),env->dr[index],0x20,
                       (CPUBreakpoint **)(env->dr + (long)index + 8));
    goto LAB_004c551f;
  case 1:
    if (!bVar6) {
      return 0;
    }
    uVar5 = (uint)(uVar1 >> (cVar2 + 0x12U & 0x3f)) & 3;
    len = 8;
    if (uVar5 != 2) {
      len = (vaddr)(uVar5 + 1);
    }
    iVar4 = 0x22;
    break;
  case 2:
    return (uint)bVar6 << 0x18;
  case 3:
    if (!bVar6) {
      return 0;
    }
    uVar5 = (uint)(uVar1 >> (cVar2 + 0x12U & 0x3f)) & 3;
    len = 8;
    if (uVar5 != 2) {
      len = (vaddr)(uVar5 + 1);
    }
    iVar4 = 0x23;
  }
  iVar4 = cpu_watchpoint_insert_x86_64
                    ((CPUState *)(env[-6].mtrr_var + 4),env->dr[index],len,iVar4,
                     (CPUWatchpoint **)(env->dr + (long)index + 8));
LAB_004c551f:
  if (iVar4 != 0) {
    env->dr[(long)index + 8] = 0;
    return 0;
  }
  return 0;
}

Assistant:

static int hw_breakpoint_insert(CPUX86State *env, int index)
{
    CPUState *cs = env_cpu(env);
    target_ulong dr7 = env->dr[7];
    target_ulong drN = env->dr[index];
    int err = 0;

    switch (hw_breakpoint_type(dr7, index)) {
    case DR7_TYPE_BP_INST:
        if (hw_breakpoint_enabled(dr7, index)) {
            err = cpu_breakpoint_insert(cs, drN, BP_CPU,
                                        &env->cpu_breakpoint[index]);
        }
        break;

    case DR7_TYPE_IO_RW:
        /* Notice when we should enable calls to bpt_io.  */
        return hw_breakpoint_enabled(env->dr[7], index)
               ? HF_IOBPT_MASK : 0;

    case DR7_TYPE_DATA_WR:
        if (hw_breakpoint_enabled(dr7, index)) {
            err = cpu_watchpoint_insert(cs, drN,
                                        hw_breakpoint_len(dr7, index),
                                        BP_CPU | BP_MEM_WRITE,
                                        &env->cpu_watchpoint[index]);
        }
        break;

    case DR7_TYPE_DATA_RW:
        if (hw_breakpoint_enabled(dr7, index)) {
            err = cpu_watchpoint_insert(cs, drN,
                                        hw_breakpoint_len(dr7, index),
                                        BP_CPU | BP_MEM_ACCESS,
                                        &env->cpu_watchpoint[index]);
        }
        break;
    }
    if (err) {
        env->cpu_breakpoint[index] = NULL;
    }
    return 0;
}